

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

SharedPtrArray<solitaire::piles::TableauPileMock,_7UL> * __thiscall
solitaire::SolitaireTest::makeSharedPtrArray<solitaire::piles::TableauPileMock,7ul>
          (SharedPtrArray<solitaire::piles::TableauPileMock,_7UL> *__return_storage_ptr__,
          SolitaireTest *this)

{
  shared_ptr<solitaire::piles::TableauPileMock> local_50;
  shared_ptr<solitaire::piles::TableauPileMock> *local_40;
  value_type *ptr;
  iterator __end0;
  iterator __begin0;
  SharedPtrArray<solitaire::piles::TableauPileMock,_7UL> *__range2;
  SolitaireTest *local_18;
  SolitaireTest *this_local;
  SharedPtrArray<solitaire::piles::TableauPileMock,_7UL> *result;
  
  __range2._7_1_ = 0;
  local_18 = this;
  this_local = (SolitaireTest *)__return_storage_ptr__;
  std::array<std::shared_ptr<solitaire::piles::TableauPileMock>,_7UL>::array(__return_storage_ptr__)
  ;
  __begin0 = __return_storage_ptr__->_M_elems;
  __end0 = std::array<std::shared_ptr<solitaire::piles::TableauPileMock>,_7UL>::begin
                     (__return_storage_ptr__);
  ptr = std::array<std::shared_ptr<solitaire::piles::TableauPileMock>,_7UL>::end
                  ((array<std::shared_ptr<solitaire::piles::TableauPileMock>,_7UL> *)__begin0);
  for (; __end0 != ptr; __end0 = __end0 + 1) {
    local_40 = __end0;
    std::make_shared<solitaire::piles::TableauPileMock>();
    std::shared_ptr<solitaire::piles::TableauPileMock>::operator=(local_40,&local_50);
    std::shared_ptr<solitaire::piles::TableauPileMock>::~shared_ptr(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

SharedPtrArray<T, N> makeSharedPtrArray() {
        SharedPtrArray<T, N> result;
        for (auto& ptr: result)
            ptr = std::make_shared<T>();
        return result;
    }